

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O2

uint aom_highbd_avg_4x4_c(uint8_t *s8,int p)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = (long)s8 * 2;
  iVar1 = 0;
  for (iVar2 = 0; iVar2 != 4; iVar2 = iVar2 + 1) {
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      iVar1 = iVar1 + (uint)*(ushort *)(lVar4 + lVar3 * 2);
    }
    lVar4 = lVar4 + (long)p * 2;
  }
  return iVar1 + 8 >> 4;
}

Assistant:

unsigned int aom_highbd_avg_4x4_c(const uint8_t *s8, int p) {
  int i, j;
  int sum = 0;
  const uint16_t *s = CONVERT_TO_SHORTPTR(s8);
  for (i = 0; i < 4; ++i, s += p)
    for (j = 0; j < 4; sum += s[j], ++j) {
    }

  return (sum + 8) >> 4;
}